

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Node * mainpositionTV(Table *t,TValue *key)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  Node *pNVar4;
  double dVar5;
  int i;
  
  bVar1 = key->tt_ & 0x3f;
  switch(bVar1) {
  case 1:
    return t->node;
  case 3:
    pNVar4 = hashint(t,(key->value_).i);
    return pNVar4;
  case 4:
    uVar3 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc));
    break;
  default:
    switch(bVar1) {
    case 0x11:
      uVar3 = (ulong)(t->lsizenode != '\0');
      goto LAB_0012e96a;
    case 0x13:
      pNVar4 = t->node;
      dVar5 = frexp((key->value_).n,&i);
      dVar5 = dVar5 * 2147483648.0;
      uVar2 = 0;
      if ((-9.223372036854776e+18 <= dVar5) && (uVar2 = 0, dVar5 < 9.223372036854776e+18)) {
        uVar2 = (int)(long)dVar5 + i;
        uVar2 = (int)uVar2 >> 0x1f ^ uVar2;
      }
      return pNVar4 + (int)uVar2 % (int)(~(-1 << (t->lsizenode & 0x1f)) | 1U);
    case 0x14:
      pNVar4 = t->node;
      uVar2 = luaS_hashlongstr((TString *)(key->value_).gc);
      return pNVar4 + (~(-1 << (t->lsizenode & 0x1f)) & uVar2);
    }
  case 2:
    uVar3 = (ulong)*(uint *)&key->value_ % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
  }
LAB_0012e96a:
  return t->node + uVar3;
}

Assistant:

static Node *mainpositionTV (const Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VNUMINT: {
      lua_Integer i = ivalue(key);
      return hashint(t, i);
    }
    case LUA_VNUMFLT: {
      lua_Number n = fltvalue(key);
      return hashmod(t, l_hashfloat(n));
    }
    case LUA_VSHRSTR: {
      TString *ts = tsvalue(key);
      return hashstr(t, ts);
    }
    case LUA_VLNGSTR: {
      TString *ts = tsvalue(key);
      return hashpow2(t, luaS_hashlongstr(ts));
    }
    case LUA_VFALSE:
      return hashboolean(t, 0);
    case LUA_VTRUE:
      return hashboolean(t, 1);
    case LUA_VLIGHTUSERDATA: {
      void *p = pvalue(key);
      return hashpointer(t, p);
    }
    case LUA_VLCF: {
      lua_CFunction f = fvalue(key);
      return hashpointer(t, f);
    }
    default: {
      GCObject *o = gcvalue(key);
      return hashpointer(t, o);
    }
  }
}